

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O2

void __thiscall absl::lts_20250127::crc_internal::CrcCordState::Poison(CrcCordState *this)

{
  _Elt_pointer pPVar1;
  PrefixCrc *prefix_crc;
  Rep *pRVar2;
  size_t sVar3;
  _Elt_pointer pPVar4;
  _Map_pointer ppPVar5;
  _Elt_pointer pPVar6;
  uint uVar7;
  undefined8 local_18;
  
  pRVar2 = mutable_rep(this);
  sVar3 = NumChunks(this);
  if (sVar3 == 0) {
    local_18 = 1;
    std::
    deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>>
    ::emplace_back<int,absl::lts_20250127::crc32c_t>
              ((deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>>
                *)&pRVar2->prefix_crc,(int *)((long)&local_18 + 4),(crc32c_t *)&local_18);
  }
  else {
    pPVar4 = (pRVar2->prefix_crc).
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pPVar6 = (pRVar2->prefix_crc).
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppPVar5 = (pRVar2->prefix_crc).
              super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pPVar1 = (pRVar2->prefix_crc).
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (pPVar4 != pPVar1) {
      uVar7 = (pPVar4->crc).crc_ + 0x2e76e41b;
      (pPVar4->crc).crc_ = uVar7 * 0x8000 | uVar7 >> 0x11;
      pPVar4 = pPVar4 + 1;
      if (pPVar4 == pPVar6) {
        pPVar4 = ppPVar5[1];
        ppPVar5 = ppPVar5 + 1;
        pPVar6 = pPVar4 + 0x20;
      }
    }
  }
  return;
}

Assistant:

void CrcCordState::Poison() {
  Rep* rep = mutable_rep();
  if (NumChunks() > 0) {
    for (auto& prefix_crc : rep->prefix_crc) {
      // This is basically CRC32::Scramble().
      uint32_t crc = static_cast<uint32_t>(prefix_crc.crc);
      crc += 0x2e76e41b;
      crc = absl::rotr(crc, 17);
      prefix_crc.crc = crc32c_t{crc};
    }
  } else {
    // Add a fake corrupt chunk.
    rep->prefix_crc.emplace_back(0, crc32c_t{1});
  }
}